

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.hpp
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
chains::Parameter<chains::phasor::Frequency>::name_abi_cxx11_
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Parameter<chains::phasor::Frequency> *this)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  allocator<char> local_51;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  long *local_30;
  ulong local_28;
  long local_20 [2];
  
  if (this->moduleName_ == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"Frequency","")
    ;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,this->moduleName_,&local_51);
    plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_30,local_28,0,'\x01');
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_40 = *plVar3;
      lStack_38 = plVar2[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar3;
      local_50 = (long *)*plVar2;
    }
    local_48 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar4 = (size_type *)(plVar2 + 2);
    if ((size_type *)*plVar2 == psVar4) {
      lVar1 = plVar2[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar4;
    }
    __return_storage_ptr__->_M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if (local_30 != local_20) {
      operator_delete(local_30,local_20[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

auto name() const
  {
    if (moduleName_) {
      return std::string{moduleName_} + ' ' + Traits::name();
    } else {
      return std::string{Traits::name()};
    }
  }